

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.h
# Opt level: O2

void __thiscall
llvm::sys::fs::directory_iterator::directory_iterator
          (directory_iterator *this,directory_entry *de,error_code *ec,bool follow_symlinks)

{
  undefined1 in_R8B;
  error_code eVar1;
  StringRef path;
  __shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  (this->State).super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->State).super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->FollowSymlinks = follow_symlinks;
  std::make_shared<llvm::sys::fs::detail::DirIterState>();
  std::__shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2> *)this,
             &local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  path.Length._0_1_ = this->FollowSymlinks;
  path.Data = (char *)(de->Path)._M_string_length;
  path.Length._1_7_ = 0;
  eVar1 = detail::directory_iterator_construct
                    ((detail *)
                     (this->State).
                     super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,(DirIterState *)(de->Path)._M_dataplus._M_p,path,(bool)in_R8B);
  ec->_M_value = eVar1._M_value;
  ec->_M_cat = eVar1._M_cat;
  update_error_code_for_current_entry(this,ec);
  return;
}

Assistant:

explicit directory_iterator(const directory_entry &de, std::error_code &ec,
                              bool follow_symlinks = true)
      : FollowSymlinks(follow_symlinks) {
    State = std::make_shared<detail::DirIterState>();
    ec = detail::directory_iterator_construct(
        *State, de.path(), FollowSymlinks);
    update_error_code_for_current_entry(ec);
  }